

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareSin2Distance<double>(Vector3<double> *x,Vector3<double> *y,double r2)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  S2LogMessage local_18;
  
  if (r2 < 2.0) {
    dVar5 = x->c_[0] - y->c_[0];
    dVar6 = x->c_[1] - y->c_[1];
    dVar2 = x->c_[2] - y->c_[2];
    dVar3 = x->c_[0] + y->c_[0];
    dVar8 = x->c_[1] + y->c_[1];
    dVar4 = x->c_[2] + y->c_[2];
    dVar7 = dVar6 * dVar4 - dVar8 * dVar2;
    dVar2 = dVar2 * dVar3 - dVar4 * dVar5;
    dVar3 = dVar8 * dVar5 - dVar3 * dVar6;
    dVar2 = (dVar3 * dVar3 + dVar2 * dVar2 + dVar7 * dVar7) * 0.25;
    if (dVar2 < 0.0) {
      dVar3 = sqrt(dVar2);
    }
    else {
      dVar3 = SQRT(dVar2);
    }
    dVar4 = (r2 * -0.25 + 1.0) * r2;
    dVar5 = dVar2 - dVar4;
    dVar2 = dVar4 * 3.3306690738754696e-16 +
            dVar3 * 6.831735839737845e-31 + dVar2 * 3.100653426266254e-15 + 1.166815364598964e-61;
    iVar1 = 1;
    if (dVar5 <= dVar2) {
      iVar1 = -(uint)(dVar5 < -dVar2);
    }
    return iVar1;
  }
  S2LogMessage::S2LogMessage
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
             ,0x1e8,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_18.stream_,"Check failed: (r2) < (2.0) ",0x1b);
  abort();
}

Assistant:

int TriageCompareSin2Distance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  S2_DCHECK_LT(r2, 2.0);  // Only valid for distance limits < 90 degrees.

  constexpr T T_ERR = rounding_epsilon<T>();
  T sin2_xy_error;
  T sin2_xy = GetSin2Distance(x, y, &sin2_xy_error);
  T sin2_r = r2 * (1 - 0.25 * r2);
  T sin2_r_error = 3 * T_ERR * sin2_r;
  T diff = sin2_xy - sin2_r;
  T error = sin2_xy_error + sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}